

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O0

bool __thiscall
CCNR::ls_solver::local_search(ls_solver *this,vector<char,_std::allocator<char>_> *init_solution)

{
  bool bVar1;
  allocator_type *__a;
  size_type sVar2;
  reference piVar3;
  reference pvVar4;
  int *piVar5;
  reference pvVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_RDI;
  ls_solver *in_stack_00000018;
  size_t k;
  int var_idx;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int in_stack_0000004c;
  ls_solver *in_stack_00000050;
  int flipv;
  bool result;
  undefined7 in_stack_ffffffffffffff68;
  value_type in_stack_ffffffffffffff6f;
  vector<int,_std::allocator<int>_> *this_00;
  size_type in_stack_ffffffffffffff88;
  ulong __n;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  ls_solver *in_stack_ffffffffffffffb0;
  vector<int,_std::allocator<int>_> local_3d;
  int local_20;
  byte local_19;
  bool local_1;
  
  local_19 = 0;
  Mersenne::seed((Mersenne *)((long)&in_RDI[0x28]._M_current + 4),*(int *)&in_RDI[0x161]._M_current)
  ;
  in_RDI[0x22]._M_current = in_RDI[0xb]._M_current;
  in_RDI[0x23]._M_current = (int *)0x0;
  __a = (allocator_type *)((long)in_RDI[10]._M_current + 10);
  local_3d.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _1_4_ = 0;
  this_00 = &local_3d;
  std::allocator<int>::allocator((allocator<int> *)0x1649bd);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88
             ,(value_type_conflict1 *)this_00,__a);
  std::vector<int,_std::allocator<int>_>::operator=
            (this_00,(vector<int,_std::allocator<int>_> *)__a);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  std::allocator<int>::~allocator((allocator<int> *)0x164a02);
  initialize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd));
  *(int *)&in_RDI[0x166]._M_current = (int)sVar2;
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd));
  if (sVar2 == 0) {
    local_1 = true;
  }
  else {
    in_RDI[0x24]._M_current = (int *)0x0;
    while ((long)in_RDI[0x24]._M_current < (long)in_RDI[0x27]._M_current) {
      if ((long)in_RDI[0x26]._M_current < (long)in_RDI[0x25]._M_current) {
        return (bool)(local_19 & 1);
      }
      local_20 = pick_var(in_stack_00000018);
      flip(in_stack_00000050,in_stack_0000004c);
      local_60._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      while (bVar1 = __gnu_cxx::operator!=
                               (in_RDI,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                        *)CONCAT17(in_stack_ffffffffffffff6f,
                                                   in_stack_ffffffffffffff68)), bVar1) {
        piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_60);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x167),(long)*piVar3);
        *pvVar4 = *pvVar4 + 1;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_60);
      }
      piVar5 = (int *)std::vector<int,_std::allocator<int>_>::size
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd));
      if (piVar5 < in_RDI[0x22]._M_current) {
        piVar5 = (int *)std::vector<int,_std::allocator<int>_>::size
                                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd));
        in_RDI[0x22]._M_current = piVar5;
        for (__n = 0; __n < (long)in_RDI[10]._M_current + 1U; __n = __n + 1) {
          pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x1c),__n);
          in_stack_ffffffffffffff6f = *pvVar6;
          pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x1f),__n);
          *pvVar6 = in_stack_ffffffffffffff6f;
        }
      }
      sVar2 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd));
      if (sVar2 == 0) {
        local_19 = 1;
        break;
      }
      in_RDI[0x24]._M_current = (int *)((long)in_RDI[0x24]._M_current + 1);
    }
    local_1 = (bool)(local_19 & 1);
  }
  return local_1;
}

Assistant:

bool ls_solver::local_search(const vector<char> *init_solution)
{
    bool result = false;
    int flipv;
    _random_gen.seed(_random_seed);
    _best_found_cost = _num_clauses;
    _best_cost_time = 0;
    conflict_ct = vector<int>(_num_vars + 10, 0);
    // for(int t=0; t < _max_tries; t++)
    // {
    initialize(init_solution);
    // cout<<"start ls"<<endl;
    _init_unsat_nums = _unsat_clauses.size();
    if (0 == _unsat_clauses.size()) {
        return true;
    } // 1
    for (_step = 0; _step < _max_steps; _step++) {
        if (_mems > _max_mems) {
            // std::cout << "c local search timeout with step "<< _step<< std::endl;
            return result;
        }
        flipv = pick_var();
        flip(flipv);
        for (int var_idx : _unsat_vars) ++conflict_ct[var_idx];
        if (_unsat_clauses.size() < _best_found_cost) {
            _best_found_cost = _unsat_clauses.size();
            for (size_t k = 0; k < _num_vars + 1; ++k) {
                _best_solution[k] = _solution[k];
            }
            // _best_cost_time = get_runtime();
        }
        if (0 == _unsat_clauses.size()) {
            result = true;
            break;
        } // 1
        // if (get_runtime() > _time_limit) {result = false;break;} //0
    }
    // if (0 == _unsat_clauses.size()) {result = true;}//1
    // if (get_runtime() > _time_limit) {result = false;break;}//0
    // }
    // _end_step = _step;
    return result;
}